

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.c
# Opt level: O1

long oggpackB_read1(oggpack_buffer *b)

{
  int iVar1;
  ulong uVar2;
  
  if (b->endbyte < b->storage) {
    iVar1 = b->endbit;
    uVar2 = (ulong)((*b->ptr >> ((byte)(7 - (char)iVar1) & 0x1f) & 1) != 0);
    b->endbit = iVar1 + 1;
    if (6 < iVar1) {
      b->endbit = 0;
      b->ptr = b->ptr + 1;
      b->endbyte = b->endbyte + 1;
      return uVar2;
    }
  }
  else {
    b->ptr = (uchar *)0x0;
    b->endbyte = b->storage;
    b->endbit = 1;
    uVar2 = 0xffffffffffffffff;
  }
  return uVar2;
}

Assistant:

long oggpackB_read1(oggpack_buffer *b){
  long ret;

  if(b->endbyte >= b->storage) goto overflow;
  ret=(b->ptr[0]>>(7-b->endbit))&1;

  b->endbit++;
  if(b->endbit>7){
    b->endbit=0;
    b->ptr++;
    b->endbyte++;
  }
  return ret;

 overflow:
  b->ptr=NULL;
  b->endbyte=b->storage;
  b->endbit=1;
  return -1L;
}